

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void __thiscall
cppcms::xss::rules::add_uri_property(rules *this,string *tag_name,string *property,string *schema)

{
  rules *in_RDX;
  string *in_RSI;
  string *in_RDI;
  validator_type *in_stack_ffffffffffffff88;
  bool in_stack_ffffffffffffffd7;
  string *in_stack_ffffffffffffffd8;
  
  uri_validator(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
  add_property(in_RDX,in_RSI,in_RDI,in_stack_ffffffffffffff88);
  std::function<bool_(const_char_*,_const_char_*)>::~function
            ((function<bool_(const_char_*,_const_char_*)> *)0x45b191);
  return;
}

Assistant:

void rules::add_uri_property(std::string const &tag_name,std::string const &property,std::string const &schema)
	{
		add_property(tag_name,property,uri_validator(schema));
	}